

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O2

Real __thiscall
amrex::BaseFab<double>::norm<(amrex::RunOn)1>
          (BaseFab<double> *this,Box *subbox,int p,int comp,int numcomp)

{
  Box *pBVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Real nrm;
  Real local_88;
  anon_class_80_3_52fafd89 local_80;
  
  local_80.nrm = &local_88;
  local_80.a.p = this->dptr;
  local_80.a.ncomp = this->nvar;
  pBVar1 = &this->domain;
  local_80.a.begin.z = (this->domain).smallend.vect[2];
  local_80.a.begin.x = (pBVar1->smallend).vect[0];
  local_80.a.begin.y = (pBVar1->smallend).vect[1];
  lVar4 = (long)(this->domain).bigend.vect[1] + 1;
  iVar2 = (this->domain).bigend.vect[0];
  lVar3 = (long)(this->domain).bigend.vect[2] + 1;
  local_80.a.jstride = ((long)iVar2 - (long)(pBVar1->smallend).vect[0]) + 1;
  local_80.a.kstride = (lVar4 - (this->domain).smallend.vect[1]) * local_80.a.jstride;
  local_80.a.nstride = (lVar3 - local_80.a.begin.z) * local_80.a.kstride;
  local_80.a.end._0_8_ = (ulong)(iVar2 + 1) | lVar4 << 0x20;
  local_88 = 0.0;
  local_80.a.end.z = (int)lVar3;
  local_80.comp = comp;
  if (p == 2) {
    LoopOnCpu<amrex::BaseFab<double>::norm<(amrex::RunOn)1>(amrex::Box_const&,int,int,int)const::_lambda(int,int,int,int)_3_>
              (subbox,numcomp,&local_80);
  }
  else if (p == 1) {
    local_80.nrm = &local_88;
    LoopOnCpu<amrex::BaseFab<double>::norm<(amrex::RunOn)1>(amrex::Box_const&,int,int,int)const::_lambda(int,int,int,int)_2_>
              (subbox,numcomp,&local_80);
  }
  else if (p == 0) {
    local_80.nrm = &local_88;
    LoopOnCpu<amrex::BaseFab<double>::norm<(amrex::RunOn)1>(amrex::Box_const&,int,int,int)const::_lambda(int,int,int,int)_1_>
              (subbox,numcomp,&local_80);
  }
  else {
    Error_host("BaseFab<T>::norm: wrong p");
  }
  return local_88;
}

Assistant:

const_array () const noexcept
    {
        return makeArray4<T const>(this->dptr, this->domain, this->nvar);
    }